

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::resize
          (mipmapped_texture *this,uint new_width,uint new_height,resample_params *params)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  component_flags new_flags;
  mip_level *pmVar4;
  vector<crnlib::mip_level_*> *pvVar5;
  mip_level **ppmVar6;
  undefined8 *in_RCX;
  uint in_EDX;
  uint in_ESI;
  uint l;
  uint f_2;
  resample_params rparams;
  image_u8 *pMip;
  image_u8 *pImg;
  image_u8 tmp;
  uint f_1;
  uint f;
  face_vec faces;
  uint in_stack_fffffffffffffe78;
  uint in_stack_fffffffffffffe7c;
  orientation_flags_t in_stack_fffffffffffffe80;
  orientation_flags_t in_stack_fffffffffffffe84;
  image_u8 *in_stack_fffffffffffffe88;
  mipmapped_texture *in_stack_fffffffffffffe90;
  mipmapped_texture *in_stack_fffffffffffffeb0;
  uint local_b8;
  uint local_b4;
  resample_params local_b0;
  mipmapped_texture *local_88;
  image_u8 *local_80;
  uint local_48;
  uint local_34;
  vector<crnlib::vector<crnlib::mip_level_*>_> local_30;
  undefined8 *local_20;
  uint local_18;
  uint local_14;
  byte local_1;
  
  local_20 = in_RCX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  bVar2 = is_valid((mipmapped_texture *)0x1708ca);
  if (bVar2) {
    get_num_faces((mipmapped_texture *)0x1708e8);
    vector<crnlib::vector<crnlib::mip_level_*>_>::vector
              ((vector<crnlib::vector<crnlib::mip_level_*>_> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe7c);
    local_34 = 0;
    while( true ) {
      uVar1 = local_34;
      uVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::size(&local_30);
      if (uVar3 <= uVar1) break;
      vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&local_30,local_34);
      vector<crnlib::mip_level_*>::resize
                ((vector<crnlib::mip_level_*> *)in_stack_fffffffffffffe90,
                 (uint)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffe88 >> 0x18,0));
      pmVar4 = crnlib_new<crnlib::mip_level>();
      pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&local_30,local_34);
      ppmVar6 = vector<crnlib::mip_level_*>::operator[](pvVar5,0);
      *ppmVar6 = pmVar4;
      local_34 = local_34 + 1;
    }
    local_48 = 0;
    while( true ) {
      uVar1 = local_48;
      uVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::size(&local_30);
      if (uVar3 <= uVar1) break;
      image<crnlib::color_quad<unsigned_char,_int>_>::image
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x170a4a);
      pmVar4 = get_level((mipmapped_texture *)
                         CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                         in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
      local_80 = mip_level::get_unpacked_image
                           ((mip_level *)in_stack_fffffffffffffe88,
                            (image_u8 *)
                            CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            in_stack_fffffffffffffe7c);
      local_88 = (mipmapped_texture *)
                 crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>>((crnlib *)pmVar4);
      image_utils::resample_params::resample_params(&local_b0);
      local_b0.m_dst_width = local_14;
      local_b0.m_dst_height = local_18;
      local_b0.m_filter_scale = *(float *)((long)local_20 + 0xc);
      local_b0.m_first_comp = 0;
      bVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::is_component_valid
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                         CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                         in_stack_fffffffffffffe7c);
      local_b0.m_num_comps = bVar2 + 3;
      local_b0.m_srgb = (bool)(*(byte *)((long)local_20 + 9) & 1);
      local_b0.m_wrapping = (bool)(*(byte *)(local_20 + 1) & 1);
      local_b0.m_pFilter = (char *)*local_20;
      local_b0.m_multithreaded = (bool)(*(byte *)((long)local_20 + 0x14) & 1);
      bVar2 = image_utils::resample
                        (in_stack_fffffffffffffe88,
                         (image_u8 *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                         (resample_params *)
                         CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      if (bVar2) {
        if ((*(byte *)((long)local_20 + 10) & 1) != 0) {
          image_utils::renorm_normal_map((image_u8 *)in_stack_fffffffffffffeb0);
        }
        in_stack_fffffffffffffeb0 = local_88;
        new_flags = image<crnlib::color_quad<unsigned_char,_int>_>::get_comp_flags(local_80);
        image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags
                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)in_stack_fffffffffffffeb0,
                   new_flags);
        pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&local_30,local_48);
        ppmVar6 = vector<crnlib::mip_level_*>::operator[](pvVar5,0);
        in_stack_fffffffffffffe88 = (image_u8 *)*ppmVar6;
        in_stack_fffffffffffffe90 = local_88;
        pmVar4 = get_level((mipmapped_texture *)
                           CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                           in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
        in_stack_fffffffffffffe84 = mip_level::get_orientation_flags(pmVar4);
        mip_level::assign((mip_level *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe84,in_stack_fffffffffffffe80);
        bVar2 = false;
      }
      else {
        crnlib_delete<crnlib::image<crnlib::color_quad<unsigned_char,int>>>
                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x170bbe);
        local_b4 = 0;
        while( true ) {
          uVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::size(&local_30);
          if (uVar3 <= local_b4) break;
          local_b8 = 0;
          while( true ) {
            pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&local_30,local_b4);
            uVar3 = vector<crnlib::mip_level_*>::size(pvVar5);
            if (uVar3 <= local_b8) break;
            pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&local_30,local_b4);
            vector<crnlib::mip_level_*>::operator[](pvVar5,local_b8);
            crnlib_delete<crnlib::mip_level>((mip_level *)0x170c8a);
            local_b8 = local_b8 + 1;
          }
          local_b4 = local_b4 + 1;
        }
        local_1 = 0;
        bVar2 = true;
      }
      image<crnlib::color_quad<unsigned_char,_int>_>::~image
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x170ded);
      if (bVar2) goto LAB_00170e3c;
      local_48 = local_48 + 1;
    }
    assign(in_stack_fffffffffffffe90,(face_vec *)in_stack_fffffffffffffe88);
    local_1 = 1;
LAB_00170e3c:
    vector<crnlib::vector<crnlib::mip_level_*>_>::~vector
              ((vector<crnlib::vector<crnlib::mip_level_*>_> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool mipmapped_texture::resize(uint new_width, uint new_height, const resample_params& params) {
  CRNLIB_ASSERT(is_valid());
  if (!is_valid())
    return false;

  CRNLIB_ASSERT((new_width >= 1) && (new_height >= 1));

  face_vec faces(get_num_faces());
  for (uint f = 0; f < faces.size(); f++) {
    faces[f].resize(1);
    faces[f][0] = crnlib_new<mip_level>();
  }

  for (uint f = 0; f < faces.size(); f++) {
    image_u8 tmp;
    image_u8* pImg = get_level(f, 0)->get_unpacked_image(tmp, cUnpackFlagUncook);

    image_u8* pMip = crnlib_new<image_u8>();

    image_utils::resample_params rparams;
    rparams.m_dst_width = new_width;
    rparams.m_dst_height = new_height;
    rparams.m_filter_scale = params.m_filter_scale;
    rparams.m_first_comp = 0;
    rparams.m_num_comps = pImg->is_component_valid(3) ? 4 : 3;
    rparams.m_srgb = params.m_srgb;
    rparams.m_wrapping = params.m_wrapping;
    rparams.m_pFilter = params.m_pFilter;
    rparams.m_multithreaded = params.m_multithreaded;

    if (!image_utils::resample(*pImg, *pMip, rparams)) {
      crnlib_delete(pMip);

      for (uint f = 0; f < faces.size(); f++)
        for (uint l = 0; l < faces[f].size(); l++)
          crnlib_delete(faces[f][l]);

      return false;
    }

    if (params.m_renormalize)
      image_utils::renorm_normal_map(*pMip);

    pMip->set_comp_flags(pImg->get_comp_flags());

    faces[f][0]->assign(pMip, PIXEL_FMT_INVALID, get_level(f, 0)->get_orientation_flags());
  }

  assign(faces);

  CRNLIB_ASSERT(check());

  return true;
}